

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

DynamicTypeHandler * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
ConvertToTypeWithItemAttributes
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance)

{
  int *piVar1;
  bool bVar2;
  ES5ArrayTypeHandlerBase<int> *pEVar3;
  
  bVar2 = JavascriptArray::IsNonES5Array(instance);
  if (bVar2) {
    pEVar3 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
             ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<int>,Js::PropertyRecord_const*>
                       ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)this,
                        instance);
  }
  else {
    pEVar3 = (ES5ArrayTypeHandlerBase<int> *)
             SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
             ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<int>,Js::PropertyRecord_const*>
                       ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)this,
                        instance);
  }
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertSimpleDictionaryToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  return (DynamicTypeHandler *)pEVar3;
}

Assistant:

DynamicTypeHandler* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(DynamicObject* instance)
    {
        return JavascriptArray::IsNonES5Array(instance) ?
            ConvertToES5ArrayType(instance) : ConvertToDictionaryType(instance);
    }